

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSplitDeque.h
# Opt level: O3

void __thiscall HighsSplitDeque::runStolenTask(HighsSplitDeque *this,HighsTask *task)

{
  HighsTask *pHVar1;
  ulong uVar2;
  ulong uVar3;
  HighsSplitDeque *pHVar4;
  bool bVar5;
  
  pHVar1 = (this->ownerData).rootTask;
  (this->ownerData).rootTask = task;
  uVar2 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  do {
    LOCK();
    uVar3 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
    bVar5 = uVar2 == uVar3;
    if (bVar5) {
      (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i = uVar2 | (ulong)this;
      uVar3 = uVar2;
    }
    UNLOCK();
    uVar2 = uVar3;
  } while (!bVar5);
  if (uVar3 == 0) {
    (*(code *)**(undefined8 **)task->taskData)(task);
  }
  LOCK();
  uVar2 = (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i;
  (task->metadata).stealer.super___atomic_base<unsigned_long>._M_i = 1;
  UNLOCK();
  pHVar4 = (HighsSplitDeque *)(uVar2 & 0xfffffffffffffffc);
  if (pHVar4 != this && pHVar4 != (HighsSplitDeque *)0x0) {
    HighsBinarySemaphore::release(&(pHVar4->stealerData).semaphore);
  }
  (this->ownerData).rootTask = pHVar1;
  checkInterrupt(this);
  return;
}

Assistant:

void runStolenTask(HighsTask* task) {
    HighsTask* prevRootTask = ownerData.rootTask;
    ownerData.rootTask = task;
    uint32_t currentHead = ownerData.head;
    try {
      HighsSplitDeque* owner = task->run(this);
      if (owner) owner->notify();
    } catch (const HighsTask::Interrupt&) {
      // in case the task was interrupted we unwind and cancel all subtasks of
      // the stolen task

      // first cancel all tasks
      for (uint32_t i = currentHead; i < ownerData.head; ++i)
        taskArray[i].cancel();

      // now remove them from our deque so that we arrive at the original state
      // before the stolen task was executed
      while (ownerData.head != currentHead) {
        std::pair<Status, HighsTask*> popResult = pop();
        assert(popResult.first != Status::kEmpty);
        // if the task was not stolen it would be up to this worker to execute
        // it now and we simply skip its execution as it is cancelled
        if (popResult.first != Status::kStolen) continue;

        // The task was stolen. Check if the stealer is already finished with
        // its execution in which case we just remove it from the deque.
        HighsSplitDeque* stealer = popResult.second->getStealerIfUnfinished();
        if (stealer == nullptr) {
          popStolen();
          continue;
        }

        // The task was stolen and the stealer is still executing the task.
        // We now wait in a spin loop until the task is marked as finished for
        // some time. We do not proceed with stealing other tasks as when there
        // is a cancelled task the likelihood of that task being cancelled too
        // might be high and our priority is to finish unwinding the chain of
        // cancelled tasks as fast as possible.
        // When the spinning proceeds for too long we request a notification
        // from the stealer when it is finished and yield control to the
        // operating system until then.
        int numTries = HighsSchedulerConstants::kNumTryFac;
        auto tStart = std::chrono::high_resolution_clock::now();

        bool isFinished = popResult.second->isFinished();

        while (!isFinished) {
          for (int i = 0; i < numTries; ++i) {
            HighsSpinMutex::yieldProcessor();
            isFinished = popResult.second->isFinished();
            if (isFinished) break;
          }

          if (!isFinished) {
            auto numMicroSecs =
                std::chrono::duration_cast<std::chrono::microseconds>(
                    std::chrono::high_resolution_clock::now() - tStart)
                    .count();

            if (numMicroSecs < HighsSchedulerConstants::kMicroSecsBeforeSleep)
              numTries *= 2;
            else {
              waitForTaskToFinish(popResult.second, stealer);
              break;
            }
          }
        }

        // the task is finished and we can safely proceed to unwind to the next
        // task
        popStolen();
      }

      // unwinding is finished for all subtasks and we can mark the task as
      // finished and then notify the owner if it is waiting for a signal
      HighsSplitDeque* owner = task->markAsFinished(this);
      if (owner) owner->notify();
    }

    ownerData.rootTask = prevRootTask;
    checkInterrupt();
  }